

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

Node __thiscall trieste::NodeDef::pop_back(NodeDef *this)

{
  bool bVar1;
  reference pvVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  NodeDef *in_RSI;
  Node NVar5;
  NodeDef *this_local;
  value_type *node;
  
  bVar1 = std::
          vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
          ::empty((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                   *)&in_RSI->children);
  if (bVar1) {
    std::shared_ptr<trieste::NodeDef>::shared_ptr((shared_ptr<trieste::NodeDef> *)this);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    pvVar2 = std::
             vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
             ::back((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                     *)&in_RSI->children);
    std::shared_ptr<trieste::NodeDef>::shared_ptr((shared_ptr<trieste::NodeDef> *)this,pvVar2);
    std::
    vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>::
    pop_back((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
              *)&in_RSI->children);
    peVar3 = std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    _Var4._M_pi = extraout_RDX_00;
    if (peVar3->parent_ == in_RSI) {
      peVar3 = std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar3->parent_ = (NodeDef *)0x0;
      _Var4._M_pi = extraout_RDX_01;
    }
  }
  NVar5.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  NVar5.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Node)NVar5.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node pop_back()
    {
      if (children.empty())
        return {};

      auto node = children.back();
      children.pop_back();

      if (node->parent_ == this)
        node->parent_ = nullptr;

      return node;
    }